

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O2

pqpair stat2pq(double val,int code,double p1,double p2,double p3)

{
  bool bVar1;
  pqpair pVar2;
  pqpair pVar3;
  int iVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  pqpair pVar8;
  int status;
  double df;
  double x;
  double q;
  double p;
  int which;
  undefined4 uStack_44;
  double bound;
  double ompr;
  int status_3;
  double local_28;
  
  dVar6 = 0.0;
  pVar8 = (pqpair)(ZEXT816(0x3ff0000000000000) << 0x40);
  df = p1;
  x = val;
  bound = p2;
  switch(code) {
  case 2:
    val = (val + 1.0) * 0.5;
    p2 = p1 * 0.5;
    p1 = p2;
    goto LAB_0010f493;
  case 3:
    pVar8 = student_s2pq(val,p1);
    break;
  case 4:
    p = 0.0;
    _which = (double)CONCAT44(uStack_44,1);
    q = 1.0;
    if (val <= 0.0) {
      return (pqpair)(ZEXT816(0x3ff0000000000000) << 0x40);
    }
    if (p1 <= 0.0) {
      return (pqpair)(ZEXT816(0x3ff0000000000000) << 0x40);
    }
    if (p2 <= 0.0) {
      return (pqpair)(ZEXT816(0x3ff0000000000000) << 0x40);
    }
    cdff(&which,&p,&q,&x,&df,&bound,&status,&ompr);
    goto LAB_0010f6e3;
  case 5:
    goto switchD_0010f0e5_caseD_5;
  case 6:
    goto switchD_0010f0e5_caseD_6;
  case 7:
LAB_0010f493:
    pVar8 = beta_s2pq(val,p1,p2);
    break;
  case 8:
    p = 0.0;
    status = 1;
    q = 1.0;
    if (val < 0.0) {
      return (pqpair)(ZEXT816(0x3ff0000000000000) << 0x40);
    }
    if (p1 <= 0.0) {
      return (pqpair)(ZEXT816(0x3ff0000000000000) << 0x40);
    }
    if (p2 < 0.0) {
      return (pqpair)(ZEXT816(0x3ff0000000000000) << 0x40);
    }
    ompr = 1.0 - p2;
    cdfbin(&status,&p,&q,&x,&df,&bound,&ompr,&status_3,(double *)&which);
    goto LAB_0010f6e3;
  case 9:
    p = 0.0;
    _which = (double)CONCAT44(uStack_44,1);
    q = 1.0;
    if (val <= 0.0) {
      return (pqpair)(ZEXT816(0x3ff0000000000000) << 0x40);
    }
    if (p1 <= 0.0) {
      return (pqpair)(ZEXT816(0x3ff0000000000000) << 0x40);
    }
    if (p2 <= 0.0) {
      return (pqpair)(ZEXT816(0x3ff0000000000000) << 0x40);
    }
    cdfgam(&which,&p,&q,&x,&df,&bound,&status,&ompr);
    goto LAB_0010f6e3;
  case 10:
    p = 0.0;
    ompr = (double)CONCAT44(ompr._4_4_,1);
    q = 1.0;
    if (val < 0.0) {
      return (pqpair)(ZEXT816(0x3ff0000000000000) << 0x40);
    }
    if (p1 < 0.0) {
      return (pqpair)(ZEXT816(0x3ff0000000000000) << 0x40);
    }
    cdfpoi((int *)&ompr,&p,&q,&x,&df,&which,&bound);
    goto LAB_0010f6e3;
  case 0xb:
    if (p2 <= 0.0) {
      return (pqpair)(ZEXT816(0x3ff0000000000000) << 0x40);
    }
    val = (val - p1) / p2;
    goto switchD_0010f0e5_caseD_5;
  case 0xc:
    p = 0.0;
    status = 1;
    q = 1.0;
    if (val <= 0.0) {
      return (pqpair)(ZEXT816(0x3ff0000000000000) << 0x40);
    }
    if (p1 <= 0.0) {
      return (pqpair)(ZEXT816(0x3ff0000000000000) << 0x40);
    }
    if (p2 <= 0.0) {
      return (pqpair)(ZEXT816(0x3ff0000000000000) << 0x40);
    }
    if (p3 < 0.0) {
      return (pqpair)(ZEXT816(0x3ff0000000000000) << 0x40);
    }
    _which = p3;
    cdffnc(&status,&p,&q,&x,&df,&bound,(double *)&which,&status_3,&ompr);
    goto LAB_0010f6e3;
  case 0xd:
    p = 0.0;
    _which = (double)CONCAT44(uStack_44,1);
    q = 1.0;
    if (val <= 0.0) {
      return (pqpair)(ZEXT816(0x3ff0000000000000) << 0x40);
    }
    if (p1 <= 0.0) {
      return (pqpair)(ZEXT816(0x3ff0000000000000) << 0x40);
    }
    if (p2 < 0.0) {
      return (pqpair)(ZEXT816(0x3ff0000000000000) << 0x40);
    }
    ompr = p2;
    cdfchn(&which,&p,&q,&x,&df,&ompr,&status,&bound);
LAB_0010f6e3:
    pVar8.q = q;
    pVar8.p = p;
    break;
  case 0xe:
    if (p2 <= 0.0) {
      return (pqpair)(ZEXT816(0x3ff0000000000000) << 0x40);
    }
    dVar6 = (val - p1) / p2;
    if (0.0 <= dVar6) {
      dVar6 = exp(dVar6);
      dVar6 = 1.0 / (dVar6 + 1.0);
      goto LAB_0010f716;
    }
    dVar6 = exp(-dVar6);
    dVar6 = 1.0 / (dVar6 + 1.0);
    goto LAB_0010f7b3;
  case 0xf:
    if (p2 <= 0.0) {
      return (pqpair)(ZEXT816(0x3ff0000000000000) << 0x40);
    }
    dVar6 = (val - p1) / p2;
    if (0.0 <= dVar6) {
      dVar6 = exp(-dVar6);
      dVar6 = dVar6 * 0.5;
      goto LAB_0010f716;
    }
    dVar6 = exp(dVar6);
    dVar6 = dVar6 * 0.5;
    goto LAB_0010f7b3;
  case 0x10:
    pVar8 = (pqpair)(ZEXT816(0x3ff0000000000000) << 0x40);
    if (p1 < p2) {
      dVar7 = (val - p1) / (p2 - p1);
      dVar6 = 1.0;
      if (dVar7 <= 1.0) {
        dVar6 = dVar7;
      }
      pVar8.q = 1.0 - dVar7;
      pVar8.p = (double)(-(ulong)(0.0 < dVar7) & (ulong)dVar6);
    }
    break;
  case 0x11:
    pVar8 = tnonc_s2pq(val,p1,p2);
    break;
  case 0x12:
    if (p2 <= 0.0) {
      return (pqpair)(ZEXT816(0x3ff0000000000000) << 0x40);
    }
    if (p3 <= 0.0) {
      return (pqpair)(ZEXT816(0x3ff0000000000000) << 0x40);
    }
    dVar6 = (val - p1) / p2;
    if (dVar6 <= 0.0) {
      return (pqpair)(ZEXT816(0x3ff0000000000000) << 0x40);
    }
    if (p3 <= 0.0) {
      return (pqpair)(ZEXT816(0x3ff0000000000000) << 0x40);
    }
    local_28 = pow(dVar6,p3);
    dVar6 = exp(-local_28);
    if (local_28 < 0.0001) {
      pVar3.q = dVar6;
      pVar3.p = (((local_28 / -24.0 + 0.16666666666666666) * local_28 + -0.5) * local_28 + 1.0) *
                local_28;
      return pVar3;
    }
    goto LAB_0010f716;
  case 0x13:
    if (val <= 0.0) {
      return (pqpair)(ZEXT816(0x3ff0000000000000) << 0x40);
    }
    if (p1 <= 0.0) {
      return (pqpair)(ZEXT816(0x3ff0000000000000) << 0x40);
    }
    val = val * val;
    goto switchD_0010f0e5_caseD_6;
  case 0x14:
    pVar8 = (pqpair)(ZEXT816(0x3ff0000000000000) << 0x40);
    if ((0.0 < p1) && (pVar8 = (pqpair)(ZEXT816(0x3ff0000000000000) << 0x40), 0.0 < p2)) {
      pVar8 = invgauss_s2pq(val / p1,p2 / p1);
    }
    break;
  case 0x15:
    if (p2 <= 0.0) {
      return (pqpair)(ZEXT816(0x3ff0000000000000) << 0x40);
    }
    dVar7 = (val - p1) / p2;
    if (-5.0 < dVar7) {
      local_28 = exp(-dVar7);
      dVar6 = exp(-local_28);
      if (local_28 < 0.0001) {
        pVar2.q = (((local_28 / -24.0 + 0.16666666666666666) * local_28 + -0.5) * local_28 + 1.0) *
                  local_28;
        pVar2.p = dVar6;
        return pVar2;
      }
    }
LAB_0010f7b3:
    pVar8.q = 1.0 - dVar6;
    pVar8.p = dVar6;
    break;
  case 0x16:
    bVar1 = 0.0 <= val;
    if (1.0 <= val) {
      val = 1.0;
    }
    dVar6 = (double)(~-(ulong)bVar1 & 0x3ff0000000000000 | (ulong)val & -(ulong)bVar1);
    goto LAB_0010f716;
  case 0x17:
    iVar4 = (int)val;
    iVar5 = -iVar4;
    if (iVar4 < 1) {
      iVar5 = iVar4;
    }
    dVar6 = exp((double)iVar5);
    goto LAB_0010f716;
  case 0x18:
    iVar4 = (int)val;
    iVar5 = -iVar4;
    if (iVar4 < 1) {
      iVar5 = iVar4;
    }
    dVar6 = pow(10.0,(double)iVar5);
LAB_0010f716:
    pVar8.q = dVar6;
    pVar8.p = 1.0 - dVar6;
  }
  return pVar8;
switchD_0010f0e5_caseD_6:
  pVar8 = chisq_s2pq(val,p1);
  return pVar8;
switchD_0010f0e5_caseD_5:
  pVar8 = normal_s2pq(val);
  return pVar8;
}

Assistant:

static pqpair stat2pq( double val, int code, double p1,double p2,double p3 )
{
   pqpair pq={0.0,1.0} ;

   switch( code ){

     case NIFTI_INTENT_CORREL:     pq = correl_s2pq  ( val, p1 )      ; break;
     case NIFTI_INTENT_TTEST:      pq = student_s2pq ( val, p1 )      ; break;
     case NIFTI_INTENT_FTEST:      pq = fstat_s2pq   ( val, p1,p2 )   ; break;
     case NIFTI_INTENT_ZSCORE:     pq = normal_s2pq  ( val )          ; break;
     case NIFTI_INTENT_CHISQ:      pq = chisq_s2pq   ( val, p1 )      ; break;
     case NIFTI_INTENT_BETA:       pq = beta_s2pq    ( val, p1,p2 )   ; break;
     case NIFTI_INTENT_BINOM:      pq = binomial_s2pq( val, p1,p2 )   ; break;
     case NIFTI_INTENT_GAMMA:      pq = gamma_s2pq   ( val, p1,p2 )   ; break;
     case NIFTI_INTENT_POISSON:    pq = poisson_s2pq ( val, p1 )      ; break;
     case NIFTI_INTENT_FTEST_NONC: pq = fnonc_s2pq   ( val, p1,p2,p3 ); break;
     case NIFTI_INTENT_CHISQ_NONC: pq = chsqnonc_s2pq( val, p1,p2    ); break;
     case NIFTI_INTENT_TTEST_NONC: pq = tnonc_s2pq   ( val, p1,p2 )   ; break;
     case NIFTI_INTENT_CHI:        pq = chi_s2pq     ( val, p1 )      ; break;

     /* these distributions are shifted and scaled copies of a standard case */

     case NIFTI_INTENT_INVGAUSS:
        if( p1 > 0.0 && p2 > 0.0 ) pq = invgauss_s2pq( val/p1,p2/p1 ) ; break;

     case NIFTI_INTENT_WEIBULL:
        if( p2 > 0.0 && p3 > 0.0 ) pq = weibull_s2pq ((val-p1)/p2,p3) ; break;

     case NIFTI_INTENT_EXTVAL:
                    if( p2 > 0.0 ) pq = extval1_s2pq ( (val-p1)/p2 )  ; break;

     case NIFTI_INTENT_NORMAL:
                    if( p2 > 0.0 ) pq = normal_s2pq  ( (val-p1)/p2 )  ; break;

     case NIFTI_INTENT_LOGISTIC:
                    if( p2 > 0.0 ) pq = logistic_s2pq( (val-p1)/p2 )  ; break;

     case NIFTI_INTENT_LAPLACE:
                    if( p2 > 0.0 ) pq = laplace_s2pq ( (val-p1)/p2 )  ; break;

     case NIFTI_INTENT_UNIFORM:
                    if( p2 > p1  ) pq = uniform_s2pq((val-p1)/(p2-p1)); break;

     /* these cases are trivial (note what is called 'p' is really 'q') */

     case NIFTI_INTENT_PVAL:
                        if( val >= 0.0 && val <= 1.0 ) pq.q = val ;
                                                       pq.p = 1.0-pq.q; break;
     case NIFTI_INTENT_LOGPVAL:
                            pq.q = exp(-abs(val))    ; pq.p = 1.0-pq.q; break;
     case NIFTI_INTENT_LOG10PVAL:
                            pq.q = pow(10.,-abs(val)); pq.p = 1.0-pq.q; break;
   }

   return pq ;
}